

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLVersionParser.cpp
# Opt level: O2

void COLLADASaxFWL::
     createFunctionMap<COLLADASaxFWL::LibraryFlagsFunctionMapPair15,std::map<unsigned_long,GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>>>>
               (int flags,int *parsedFlags,
               map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
               *functionMap,LibraryFlagsFunctionMapPair15 *flagsMapMap,size_t flagsMapMapSize)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  LibraryFlags LVar4;
  LibraryFlags LVar5;
  ElementFunctionMap **ppEVar6;
  bool bVar7;
  
  if ((~flags & 0x1ffffU) != 0) {
    uVar1 = *parsedFlags;
    iVar3 = (flags & 2U) * 0x100000;
    LVar5 = iVar3 + (flags & 1U);
    LVar4 = iVar3 + 0x100004 + (flags & 1U);
    if ((uVar1 & 4) != 0) {
      LVar4 = LVar5;
    }
    if ((flags & 4U) == 0) {
      LVar4 = LVar5;
    }
    LVar5 = LVar4 | (COLLADA_LIBRARY_NODES|COLLADA_LIBRARY_ANIMATIONS);
    if ((uVar1 & 8) != 0) {
      LVar5 = LVar4;
    }
    if ((flags & 8U) == 0) {
      LVar5 = LVar4;
    }
    LVar5 = (flags & 0x20U) << 10 | flags << 5 & COLLADA_LIBRARY_GEOMETRIES | LVar5;
    LVar4 = LVar5 | (COLLADA_LIBRARY_EFFECTS|COLLADA_LIBRARY_ANIMATIONS);
    if ((uVar1 & 0x40) != 0) {
      LVar4 = LVar5;
    }
    if ((flags & 0x40U) == 0) {
      LVar4 = LVar5;
    }
    LVar5 = COLLADA_LIBRARY_VISUAL_SCENES|COLLADA_LIBRARY_NODES|COLLADA_LIBRARY_EFFECTS|
            COLLADA_LIBRARY_ANIMATIONS;
    if (((uint)flags >> 0xb & 1) == 0) {
      LVar5 = (uint)flags >> 8 & COLLADA_LIBRARY_ANIMATIONS;
    }
    LVar4 = ((uint)flags >> 3 & 0x10) + (flags & 0x100U) * 4 | flags << 5 & COLLADA_LIBRARY_LIGHTS |
            LVar5 | LVar4;
    LVar5 = LVar4 | (COLLADA_LIBRARY_VISUAL_SCENES|COLLADA_LIBRARY_NODES|COLLADA_LIBRARY_CONTROLLERS
                    );
    if (((uint)flags >> 0xd & 1) == 0) {
      LVar5 = LVar4;
    }
    ppEVar6 = &flagsMapMap->functionMap;
    while (bVar7 = flagsMapMapSize != 0, flagsMapMapSize = flagsMapMapSize - 1, bVar7) {
      if ((((LibraryFlagsFunctionMapPair15 *)(ppEVar6 + -1))->flag &
          ((uint)flags >> 7 & COLLADA_LIBRARY_CONTROLLERS | LVar5)) != COLLADA_NO_FLAGS) {
        std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>,std::_Select1st<std::pair<unsigned_long_const,GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>>>
        ::
        _M_insert_range_unique<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>>>
                  ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>,std::_Select1st<std::pair<unsigned_long_const,GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>>>
                    *)functionMap,((*ppEVar6)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left
                   ,(_Rb_tree_const_iterator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>
                     )&((*ppEVar6)->_M_t)._M_impl.super__Rb_tree_header);
      }
      ppEVar6 = ppEVar6 + 2;
    }
    uVar2 = uVar1 | flags | 0x4c;
    if (((uint)flags >> 0xb & 1) == 0) {
      uVar2 = uVar1 | flags;
    }
    uVar1 = uVar2 | 0xc;
    if (((uint)flags >> 0xd & 1) == 0) {
      uVar1 = uVar2;
    }
    *parsedFlags = uVar1;
  }
  return;
}

Assistant:

void createFunctionMap( int flags, int& parsedFlags, ElementFunctionMap& functionMap, FlagsMapPair* flagsMapMap, size_t flagsMapMapSize )
    {
        // A combination of ObjectFlags, indicating which objects will have been parsed, after load() 
        // has been called. These will be contained for sure.
        // We need this to ensure that objects that are store by the Loader ( visual scene, library nodes, 
        // effects, cameras, lights) are parsed only once.
        int afterLoadParsedObjectFlags = parsedFlags | flags;

        if ( (flags & Loader::ALL_OBJECTS_MASK ) != Loader::ALL_OBJECTS_MASK )
        {
            // we need to set a customized function map, since we don't need all COLLADA libraries 
            //determine which COLLADA elements we need to parse to get all date needed to parse objects in mObjectFlags
            int requiredFunctionMaps = 0;

            if ( (flags & Loader::ASSET_FLAG) != 0 )
            {
                requiredFunctionMaps|= COLLADA_ASSET;
            }

            if ( (flags & Loader::SCENE_FLAG) != 0 )
            {
                requiredFunctionMaps|= COLLADA_SCENE;
            }

            if ( setInFirstUnsetInSecond(flags, parsedFlags, Loader::VISUAL_SCENES_FLAG) )
            {
                requiredFunctionMaps|= COLLADA_LIBRARY_VISUAL_SCENES;
                requiredFunctionMaps|= COLLADA_LIBRARY_ANIMATIONS;
            }

            if ( setInFirstUnsetInSecond(flags, parsedFlags, Loader::LIBRARY_NODES_FLAG) )
            {
                requiredFunctionMaps|= COLLADA_LIBRARY_NODES;
                requiredFunctionMaps|= COLLADA_LIBRARY_ANIMATIONS;
            }

            if ( (flags & Loader::GEOMETRY_FLAG) != 0 )
            {
                requiredFunctionMaps|= COLLADA_LIBRARY_GEOMETRIES;
            }

            if ( (flags & Loader::MATERIAL_FLAG) != 0 )
            {
                requiredFunctionMaps|= COLLADA_LIBRARY_MATERIALS;
            }

            if ( setInFirstUnsetInSecond(flags, parsedFlags, Loader::EFFECT_FLAG) )
            {
                requiredFunctionMaps|= COLLADA_LIBRARY_EFFECTS;
                requiredFunctionMaps|= COLLADA_LIBRARY_ANIMATIONS;
            }

            if ( (flags & Loader::CAMERA_FLAG) != 0 )
            {
                requiredFunctionMaps|= COLLADA_LIBRARY_CAMERAS;
                //requiredFunctionMaps|= COLLADA_LIBRARY_ANIMATIONS;
            }

            if ( (flags & Loader::IMAGE_FLAG) != 0 )
            {
                requiredFunctionMaps|= COLLADA_LIBRARY_IMAGES;
            }

            if ( (flags & Loader::LIGHT_FLAG) != 0 )
            {
                requiredFunctionMaps|= COLLADA_LIBRARY_LIGHTS;
            }

            if ( (flags & Loader::ANIMATION_FLAG) != 0 )
            {
                requiredFunctionMaps|= COLLADA_LIBRARY_ANIMATIONS;
            }

            if ( (flags & Loader::ANIMATION_LIST_FLAG) != 0 )
            {
                requiredFunctionMaps|= COLLADA_LIBRARY_ANIMATIONS;

                requiredFunctionMaps|= COLLADA_LIBRARY_VISUAL_SCENES;
                afterLoadParsedObjectFlags |= Loader::VISUAL_SCENES_FLAG;

                requiredFunctionMaps|= COLLADA_LIBRARY_NODES;
                afterLoadParsedObjectFlags |= Loader::LIBRARY_NODES_FLAG;

                requiredFunctionMaps|= COLLADA_LIBRARY_EFFECTS;
                afterLoadParsedObjectFlags |= Loader::EFFECT_FLAG;

                //requiredFunctionMaps|= COLLADA_LIBRARY_CAMERAS;
                //requiredFunctionMaps|= COLLADA_LIBRARY_LIGHTS;
            }

            if ( (flags & Loader::CONTROLLER_FLAG) != 0 )
            {
                requiredFunctionMaps|= COLLADA_LIBRARY_CONTROLLERS;

                requiredFunctionMaps|= COLLADA_LIBRARY_VISUAL_SCENES;
                afterLoadParsedObjectFlags |= Loader::VISUAL_SCENES_FLAG;

                requiredFunctionMaps|= COLLADA_LIBRARY_NODES;
                afterLoadParsedObjectFlags |= Loader::LIBRARY_NODES_FLAG;
            }

            if ( (flags & Loader::SKIN_CONTROLLER_DATA_FLAG) != 0 )
            {
                requiredFunctionMaps|= COLLADA_LIBRARY_CONTROLLERS;
            }


            // Fills function map
            for ( size_t i = 0; i < flagsMapMapSize; ++i )
            {
                const FlagsMapPair& libraryFlagsFunctionMapPair = flagsMapMap[i];
                if ( (requiredFunctionMaps & libraryFlagsFunctionMapPair.flag) != 0 )
                {
                    functionMap.insert(libraryFlagsFunctionMapPair.functionMap.begin(), libraryFlagsFunctionMapPair.functionMap.end());
                }
            }

            parsedFlags = afterLoadParsedObjectFlags;
        }
    }